

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O0

bool __thiscall
ON_3dmObjectAttributes::UpdateReferencedComponents
          (ON_3dmObjectAttributes *this,ON_ComponentManifest *source_manifest,
          ON_ComponentManifest *destination_manifest,ON_ManifestMap *manifest_map)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int *piVar4;
  int local_48;
  int local_44;
  int destination_group_index_index;
  int group_index;
  uint i;
  uint group_count;
  int destination_line_pattern_index;
  int destination_material_index;
  int destination_layer_index;
  bool rc;
  ON_ManifestMap *manifest_map_local;
  ON_ComponentManifest *destination_manifest_local;
  ON_ComponentManifest *source_manifest_local;
  ON_3dmObjectAttributes *this_local;
  
  destination_material_index._3_1_ = 1;
  _destination_layer_index = manifest_map;
  manifest_map_local = (ON_ManifestMap *)destination_manifest;
  destination_manifest_local = source_manifest;
  source_manifest_local = (ON_ComponentManifest *)this;
  if (-1 < this->m_layer_index) {
    destination_line_pattern_index = -0x7fffffff;
    bVar2 = ON_ManifestMap::GetAndValidateDestinationIndex
                      (manifest_map,Layer,this->m_layer_index,destination_manifest,
                       &destination_line_pattern_index);
    if (bVar2) {
      this->m_layer_index = destination_line_pattern_index;
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_attributes.cpp"
                 ,0x11b,"","Unable to update layer reference.");
      destination_material_index._3_1_ = 0;
      this->m_layer_index = DefaultAttributes.m_layer_index;
    }
  }
  if (-1 < this->m_material_index) {
    group_count = 0x80000001;
    bVar2 = ON_ManifestMap::GetAndValidateDestinationIndex
                      (_destination_layer_index,Material,this->m_material_index,
                       (ON_ComponentManifest *)manifest_map_local,(int *)&group_count);
    if (bVar2) {
      this->m_material_index = group_count;
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_attributes.cpp"
                 ,299,"","Unable to update render material reference.");
      destination_material_index._3_1_ = 0;
      this->m_material_index = DefaultAttributes.m_material_index;
    }
  }
  if (-1 < this->m_linetype_index) {
    i = 0x80000001;
    bVar2 = ON_ManifestMap::GetAndValidateDestinationIndex
                      (_destination_layer_index,LinePattern,this->m_linetype_index,
                       (ON_ComponentManifest *)manifest_map_local,(int *)&i);
    if (bVar2) {
      this->m_linetype_index = i;
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_attributes.cpp"
                 ,0x13b,"","Unable to update line pattern reference.");
      destination_material_index._3_1_ = 0;
      this->m_linetype_index = DefaultAttributes.m_linetype_index;
    }
  }
  group_index = 0;
  for (destination_group_index_index = 0; iVar1 = destination_group_index_index,
      uVar3 = ON_SimpleArray<int>::UnsignedCount(&this->m_group), (uint)iVar1 < uVar3;
      destination_group_index_index = destination_group_index_index + 1) {
    piVar4 = ON_SimpleArray<int>::operator[](&this->m_group,destination_group_index_index);
    local_44 = *piVar4;
    local_48 = -0x7fffffff;
    bVar2 = ON_ManifestMap::GetAndValidateDestinationIndex
                      (_destination_layer_index,Group,local_44,
                       (ON_ComponentManifest *)manifest_map_local,&local_48);
    iVar1 = local_48;
    if (bVar2) {
      if (local_48 < 0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_attributes.cpp"
                   ,0x14f,"","Unable to update group reference.");
        destination_material_index._3_1_ = 0;
      }
      else {
        piVar4 = ON_SimpleArray<int>::operator[](&this->m_group,group_index);
        *piVar4 = iVar1;
        group_index = group_index + 1;
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_attributes.cpp"
                 ,0x149,"","Unable to update group reference.");
      destination_material_index._3_1_ = 0;
    }
  }
  ON_SimpleArray<int>::SetCount(&this->m_group,group_index);
  return (bool)(destination_material_index._3_1_ & 1);
}

Assistant:

bool ON_3dmObjectAttributes::UpdateReferencedComponents(
  const class ON_ComponentManifest& source_manifest,
  const class ON_ComponentManifest& destination_manifest,
  const class ON_ManifestMap& manifest_map
  )
{
  bool rc = true;

  // Update layer reference
  if (m_layer_index >= 0)
  {
    int destination_layer_index = ON_UNSET_INT_INDEX;
    if (manifest_map.GetAndValidateDestinationIndex(ON_ModelComponent::Type::Layer, m_layer_index, destination_manifest, &destination_layer_index))
    {
      m_layer_index = destination_layer_index;
    }
    else
    {
      ON_ERROR("Unable to update layer reference.");
      rc = false;
      m_layer_index = ON_3dmObjectAttributes::DefaultAttributes.m_layer_index;
    }
  }

  // Update render material reference
  if (m_material_index >= 0)
  {
    int destination_material_index = ON_UNSET_INT_INDEX;
    if (manifest_map.GetAndValidateDestinationIndex(ON_ModelComponent::Type::RenderMaterial, m_material_index, destination_manifest, &destination_material_index))
    {
      m_material_index = destination_material_index;
    }
    else
    {
      ON_ERROR("Unable to update render material reference.");
      rc = false;
      m_material_index = ON_3dmObjectAttributes::DefaultAttributes.m_material_index;
    }
  }

  // Update line pattern reference
  if (m_linetype_index >= 0)
  {
    int destination_line_pattern_index = ON_UNSET_INT_INDEX;
    if (manifest_map.GetAndValidateDestinationIndex(ON_ModelComponent::Type::LinePattern, m_linetype_index, destination_manifest, &destination_line_pattern_index))
    {
      m_linetype_index = destination_line_pattern_index;
    }
    else
    {
      ON_ERROR("Unable to update line pattern reference.");
      rc = false;
      m_linetype_index = ON_3dmObjectAttributes::DefaultAttributes.m_linetype_index;
    }
  }

  // Update group references
  unsigned int group_count = 0;
  for (unsigned int i = 0; i < m_group.UnsignedCount(); i++)
  {
    int group_index = m_group[i];
    int destination_group_index_index = ON_UNSET_INT_INDEX;
    if (!manifest_map.GetAndValidateDestinationIndex(ON_ModelComponent::Type::Group, group_index, destination_manifest, &destination_group_index_index))
    {
      ON_ERROR("Unable to update group reference.");
      rc = false;
      continue;
    }
    if (destination_group_index_index < 0)
    {
      ON_ERROR("Unable to update group reference.");
      rc = false;
      continue;
    }
    m_group[group_count] = destination_group_index_index;
    group_count++;
  }
  m_group.SetCount(group_count);

  return rc;
}